

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int lws_system_blob_get_single_ptr(lws_system_blob_t *b,uint8_t **ptr)

{
  uint8_t **ptr_local;
  lws_system_blob_t *b_local;
  
  if (b->is_direct == '\0') {
    if ((b->u).bl == (lws_buflist *)0x0) {
      b_local._4_4_ = -1;
    }
    else if (((b->u).bl)->next == (lws_buflist *)0x0) {
      *ptr = (uint8_t *)&(b->u).bl[1].pos;
      b_local._4_4_ = 0;
    }
    else {
      b_local._4_4_ = -1;
    }
  }
  else {
    *ptr = (uint8_t *)(b->u).bl;
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int
lws_system_blob_get_single_ptr(lws_system_blob_t *b, const uint8_t **ptr)
{
	if (b->is_direct) {
		*ptr = b->u.direct.ptr;
		return 0;
	}

	if (!b->u.bl)
		return -1;

	if (b->u.bl->next)
		return -1;  /* multipart buflist, no single pointer to it all */

	*ptr = (const uint8_t *)&b->u.bl[1] + LWS_PRE;

	return 0;
}